

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebAssemblyEnvironment.cpp
# Opt level: O1

WasmScriptFunction * __thiscall
Js::WebAssemblyEnvironment::GetWasmFunction(WebAssemblyEnvironment *this,uint32 index)

{
  Type *ptr;
  Type TVar1;
  uint32 maxCount;
  WasmScriptFunction *pWVar2;
  
  TVar1 = WebAssemblyModule::GetFunctionIndexType((this->module).ptr,index);
  if (TVar1 != Function) {
    TVar1 = WebAssemblyModule::GetFunctionIndexType((this->module).ptr,index);
    if (TVar1 != ImportThunk) {
      Throw::InternalError();
    }
  }
  ptr = (this->functions).ptr;
  maxCount = WebAssemblyModule::GetWasmFunctionCount((this->module).ptr);
  pWVar2 = GetVarElement<Js::WasmScriptFunction>(this,ptr,index,maxCount);
  return pWVar2;
}

Assistant:

WasmScriptFunction* WebAssemblyEnvironment::GetWasmFunction(uint32 index) const
{
    if (!(module->GetFunctionIndexType(index) == Wasm::FunctionIndexTypes::Function ||
          module->GetFunctionIndexType(index) == Wasm::FunctionIndexTypes::ImportThunk))
    {
        Js::Throw::InternalError();
    }
    return GetVarElement<WasmScriptFunction>(functions, index, module->GetWasmFunctionCount());
}